

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O1

void test_fully_sparse_files(void)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  archive *a;
  char *path;
  
  pcVar3 = getenv("SKIP_TEST_SPARSE");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = getcwd((char *)0x0,0);
    path = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
    ;
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                             ,L'ʨ',(uint)(pcVar3 != (char *)0x0),"cwd != NULL",(void *)0x0);
    if (wVar1 == L'\0') {
      return;
    }
    iVar2 = is_sparse_supported(path);
    if (iVar2 != 0) {
      a = archive_read_disk_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'ʲ',(uint)(a != (archive *)0x0),"(a = archive_read_disk_new()) != NULL",
                       (void *)0x0);
      verify_sparse_file(a,"file0",(sparse *)&DAT_002bcd00,1);
      iVar2 = archive_read_free(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ʷ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      free(pcVar3);
      return;
    }
    free(pcVar3);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ʬ');
    pcVar3 = 
    "This filesystem or platform do not support the reporting of the holes of a sparse file through API such as lseek(HOLE)"
    ;
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ʜ');
    pcVar3 = "Skipping sparse tests due to SKIP_TEST_SPARSE environment variable";
  }
  test_skipping(pcVar3);
  return;
}

Assistant:

DEFINE_TEST(test_fully_sparse_files)
{
	char *cwd;
	struct archive *a;
	const char *skip_sparse_tests;

	const struct sparse sparse_file[] = {
		{ HOLE, MIN_HOLE }, { END, 0 }
	};

	skip_sparse_tests = getenv("SKIP_TEST_SPARSE");
	if (skip_sparse_tests != NULL) {
		skipping("Skipping sparse tests due to SKIP_TEST_SPARSE "
		    "environment variable");
		return;
	}

	/* Check if the filesystem where CWD on can
	 * report the number of the holes of a sparse file. */
#if defined(PATH_MAX) && !defined(__GLIBC__)
	cwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	cwd = getcwd(NULL, 0);
#endif
	if (!assert(cwd != NULL))
		return;
	if (!is_sparse_supported(cwd)) {
		free(cwd);
		skipping("This filesystem or platform do not support "
		    "the reporting of the holes of a sparse file through "
		    "API such as lseek(HOLE)");
		return;
	}

	assert((a = archive_read_disk_new()) != NULL);

	/* Fully sparse files are encoded with a zero-length "data" block. */
	verify_sparse_file(a, "file0", sparse_file, 1);

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(cwd);
}